

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O0

SSL_SESSION * SSL_get_session(SSL *ssl)

{
  bool bVar1;
  pointer hs_00;
  SSL_HANDSHAKE *hs;
  SSL *ssl_local;
  
  bVar1 = std::operator!=((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                          (ssl->handshake_func + 0x200),(nullptr_t)0x0);
  if (bVar1) {
    ssl_local = (SSL *)std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                 ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                  (ssl->handshake_func + 0x200));
  }
  else {
    hs_00 = std::unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter>::get
                      ((unique_ptr<bssl::SSL_HANDSHAKE,_bssl::internal::Deleter> *)
                       (ssl->handshake_func + 0x118));
    if (hs_00 == (pointer)0x0) {
      __assert_fail("hs != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x418,"SSL_SESSION *SSL_get_session(const SSL *)");
    }
    if ((((byte)(*(ushort *)(ssl->handshake_func + 0xdc) >> 4) & 1 ^ 0xff) & 1) == 0) {
      __assert_fail("!ssl->s3->initial_handshake_complete",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x419,"SSL_SESSION *SSL_get_session(const SSL *)");
    }
    bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&hs_00->early_session);
    if (bVar1) {
      ssl_local = (SSL *)std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                   (&hs_00->early_session);
    }
    else {
      ssl_local = (SSL *)bssl::ssl_handshake_session(hs_00);
    }
  }
  return (SSL_SESSION *)ssl_local;
}

Assistant:

SSL_SESSION *SSL_get_session(const SSL *ssl) {
  // Once the initially handshake completes, we return the most recently
  // established session. In particular, if there is a pending renegotiation, we
  // do not return information about it until it completes.
  //
  // Code in the handshake must either use |hs->new_session| (if updating a
  // partial session) or |ssl_handshake_session| (if trying to query properties
  // consistently across TLS 1.2 resumption and other handshakes).
  if (ssl->s3->established_session != nullptr) {
    return ssl->s3->established_session.get();
  }

  // Otherwise, we must be in the initial handshake.
  SSL_HANDSHAKE *hs = ssl->s3->hs.get();
  assert(hs != nullptr);
  assert(!ssl->s3->initial_handshake_complete);

  // Return the 0-RTT session, if in the 0-RTT state. While the handshake has
  // not actually completed, the public accessors all report properties as if
  // it has.
  if (hs->early_session) {
    return hs->early_session.get();
  }

  // Otherwise, return the partial session.
  return (SSL_SESSION *)ssl_handshake_session(hs);
}